

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_setnativedebughook(HSQUIRRELVM v,SQDEBUGHOOK hook)

{
  SQObjectPtr *in_RSI;
  long in_RDI;
  
  *(SQObjectPtr **)(in_RDI + 0x98) = in_RSI;
  SQObjectPtr::Null(in_RSI);
  *(byte *)(in_RDI + 0x90) = -(in_RSI != (SQObjectPtr *)0x0) & 1;
  return;
}

Assistant:

void sq_setnativedebughook(HSQUIRRELVM v,SQDEBUGHOOK hook)
{
    v->_debughook_native = hook;
    v->_debughook_closure.Null();
    v->_debughook = hook?true:false;
}